

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O2

void __thiscall
ConfidentialTransactionContext_SetAssetIssuanceTest2_Test::
~ConfidentialTransactionContext_SetAssetIssuanceTest2_Test
          (ConfidentialTransactionContext_SetAssetIssuanceTest2_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, SetAssetIssuanceTest2)
{
    // not token
    ConfidentialTransactionContext tx_base(
        "020000000001fa8f7f752deb920f5d94331e880c2f514016c58663496ff33cc9c2368adec3880000000000ffffffff020151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef01000000003b9328e00017a9149d4a252d04e5072497ef2ac59574b1b14a7831b18701f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000");
    ConfidentialTransactionContext expect_tx(
        "020000000001fa8f7f752deb920f5d94331e880c2f514016c58663496ff33cc9c2368adec3880000008000ffffffff0000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000001000000001dcd6500010000000000000000030151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef01000000003b9328e00017a9149d4a252d04e5072497ef2ac59574b1b14a7831b18701f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a1200000019768c01041eb448973f1870c4d9cef5f2b3d883b5844ee3579bb8e52771bcbf301000000001dcd6500001976a9148bba9241b14f785130e7ff186901997a5a1cc65688ac00000000");

    // not blind
    ConfidentialTransactionContext tx(tx_base);
    Txid txid("88c3de8a36c2c93cf36f496386c51640512f0c881e33945d0f92eb2d757f8ffa");
    Amount asset_amount = Amount(500000000);
    Amount token_amount;
    Address asset_address("2dnAZpPK76YhzKRcqMv4iBkLcMF4gP6aJ32", cfd::core::GetElementsAddressFormatList());
    ByteData256 contract_hash;
    bool is_blind = false;
    IssuanceParameter param;
    IssuanceOutputParameter issue_output;
    IssuanceOutputParameter token_output;
    issue_output.address = asset_address;
    issue_output.amount = asset_amount;
    EXPECT_NO_THROW(
        (param = tx.SetAssetIssuance(OutPoint(txid, 0), asset_amount,
                                     issue_output, token_amount,
                                     token_output, is_blind,
                                     contract_hash)));
    EXPECT_STREQ(tx.GetHex().c_str(), expect_tx.GetHex().c_str());
    EXPECT_STREQ(
        param.entropy.GetHex().c_str(),
        "c933a36fc6fbc1ccc50a8c73dbb7711b9958f3b1367c94ac3d3cae495aaf311f");
}